

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O0

int __thiscall
crnlib::command_line_params::get_value_as_int
          (command_line_params *this,char *pKey,uint index,int def,int l,int h,uint value_index)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  dynamic_string *this_00;
  char **pBuf;
  uint in_ECX;
  undefined8 in_RSI;
  ulong uVar4;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  char *p;
  int val;
  param_map_const_iterator it;
  command_line_params *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar5;
  uint local_3c;
  _Self in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd0;
  uint local_4;
  
  get_param((command_line_params *)CONCAT44(in_R8D,in_R9D),(char *)in_stack_ffffffffffffffd0._M_node
            ,(uint)((ulong)in_stack_ffffffffffffffc8._M_node >> 0x20));
  end(in_stack_ffffffffffffff98);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8);
  uVar5 = true;
  if (!bVar1) {
    in_stack_ffffffffffffffa4 = in_stack_00000008;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                           *)CONCAT44(in_stack_00000008,in_stack_ffffffffffffffa0));
    uVar2 = vector<crnlib::dynamic_string>::size(&(ppVar3->second).m_values);
    uVar5 = uVar2 <= in_stack_ffffffffffffffa4;
  }
  local_4 = in_ECX;
  if ((bool)uVar5 == false) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>
                           *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    this_00 = vector<crnlib::dynamic_string>::operator[]
                        (&(ppVar3->second).m_values,in_stack_00000008);
    pBuf = (char **)dynamic_string::get_ptr(this_00);
    bVar1 = string_to_int(pBuf,(int *)CONCAT17(uVar5,in_stack_ffffffffffffffb0));
    if (bVar1) {
      if ((int)local_3c < (int)in_R8D) {
        uVar4 = (ulong)local_3c;
        local_3c = in_R8D;
        console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",uVar4,
                         in_RSI,(ulong)in_R8D);
      }
      else if ((int)in_R9D < (int)local_3c) {
        uVar4 = (ulong)local_3c;
        local_3c = in_R9D;
        console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",uVar4,
                         in_RSI,(ulong)in_R9D);
      }
      local_4 = local_3c;
    }
    else {
      console::warning("Invalid value specified for parameter \"%s\", using default value of %i",
                       in_RSI,(ulong)in_ECX);
    }
  }
  return local_4;
}

Assistant:

int command_line_params::get_value_as_int(const char* pKey, uint index, int def, int l, int h, uint value_index) const {
  param_map_const_iterator it = get_param(pKey, index);
  if ((it == end()) || (value_index >= it->second.m_values.size()))
    return def;

  int val;
  const char* p = it->second.m_values[value_index].get_ptr();
  if (!string_to_int(p, val)) {
    crnlib::console::warning("Invalid value specified for parameter \"%s\", using default value of %i", pKey, def);
    return def;
  }

  if (val < l) {
    crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, l);
    val = l;
  } else if (val > h) {
    crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, h);
    val = h;
  }

  return val;
}